

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubTransport_AMQP_Common_GetTwinAsync
          (IOTHUB_DEVICE_HANDLE handle,IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK completionCallback,
          void *callbackContext)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  undefined8 *context;
  char *pcVar4;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0 ||
      completionCallback == (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                ,"IoTHubTransport_AMQP_Common_GetTwinAsync",0x684,1,
                "Invalid argument (handle=%p, completionCallback=%p)",handle,completionCallback);
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  sVar3 = get_number_of_registered_devices(*(AMQP_TRANSPORT_INSTANCE **)((long)handle + 0x10));
  if (sVar3 == 1) {
    context = (undefined8 *)malloc(0x10);
    if (context != (undefined8 *)0x0) {
      *context = completionCallback;
      context[1] = callbackContext;
      iVar1 = amqp_device_get_twin_async
                        (*(AMQP_DEVICE_HANDLE *)((long)handle + 8),
                         on_device_get_twin_completed_callback,context);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_GetTwinAsync",0x6a0,1,
                    "Failed subscribing for device Twin updates");
        }
        free(context);
        return IOTHUB_CLIENT_ERROR;
      }
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = "Failed creating context for get twin";
    iVar1 = 0x696;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = "Device Twin not supported on device multiplexing scenario";
    iVar1 = 0x68d;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
            ,"IoTHubTransport_AMQP_Common_GetTwinAsync",iVar1,1,pcVar4);
  return IOTHUB_CLIENT_ERROR;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_AMQP_Common_GetTwinAsync(IOTHUB_DEVICE_HANDLE handle, IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK completionCallback, void* callbackContext)
{
    (void)callbackContext;

    IOTHUB_CLIENT_RESULT result;

    if (handle == NULL || completionCallback == NULL)
    {
        LogError("Invalid argument (handle=%p, completionCallback=%p)", handle, completionCallback);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;

        if (get_number_of_registered_devices(registered_device->transport_instance) != 1)
        {
            LogError("Device Twin not supported on device multiplexing scenario");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            AMQP_TRANSPORT_GET_TWIN_CONTEXT* getTwinCtx;

            if ((getTwinCtx = malloc(sizeof(AMQP_TRANSPORT_GET_TWIN_CONTEXT))) == NULL)
            {
                LogError("Failed creating context for get twin");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                getTwinCtx->on_get_twin_completed_callback = completionCallback;
                getTwinCtx->user_context = callbackContext;

                if (amqp_device_get_twin_async(registered_device->device_handle, on_device_get_twin_completed_callback, (void*)getTwinCtx) != RESULT_OK)
                {
                    LogError("Failed subscribing for device Twin updates");
                    free(getTwinCtx);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }

    return result;
}